

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-string.h
# Opt level: O2

String * __thiscall testing::internal::String::operator=(String *this,String *rhs)

{
  if (this != rhs) {
    if (this->c_str_ != (char *)0x0) {
      operator_delete__(this->c_str_);
    }
    if (rhs->c_str_ == (char *)0x0) {
      this->c_str_ = (char *)0x0;
      this->length_ = 0;
    }
    else {
      ConstructNonNull(this,rhs->c_str_,rhs->length_);
    }
  }
  return this;
}

Assistant:

const String& operator=(const String& rhs) {
    if (this != &rhs) {
      delete[] c_str_;
      if (rhs.c_str() == NULL) {
        c_str_ = NULL;
        length_ = 0;
      } else {
        ConstructNonNull(rhs.c_str(), rhs.length());
      }
    }

    return *this;
  }